

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  vector<Word,_std::allocator<Word>_> program;
  Assembler assembler;
  VM vm;
  _Vector_base<Word,_std::allocator<Word>_> local_250;
  _Vector_base<Word,_std::allocator<Word>_> local_238;
  ifstream ifs;
  int aiStack_200 [122];
  
  std::ifstream::ifstream(&ifs);
  iVar2 = 0;
  if (argc == 2) {
    std::ifstream::open((char *)&ifs,(_Ios_Openmode)argv[1]);
    if (*(int *)((long)aiStack_200 + *(long *)(_ifs + -0x18)) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Unable to open file");
      std::endl<char,std::char_traits<char>>(poVar1);
      iVar2 = 1;
      goto LAB_0010e049;
    }
    assembler._sourceStream = (istream *)&ifs;
    Assembler::compile(&program,&assembler);
    VM::VM(&vm);
    std::vector<Word,_std::allocator<Word>_>::vector
              ((vector<Word,_std::allocator<Word>_> *)&local_250,&program);
    VM::load(&vm,(vector<Word,_std::allocator<Word>_> *)&local_250);
    std::_Vector_base<Word,_std::allocator<Word>_>::~_Vector_base(&local_250);
    VM::run(&vm);
  }
  else {
    if (argc != 1) goto LAB_0010e049;
    std::ifstream::open((char *)&ifs,0x10f609);
    if (*(int *)((long)aiStack_200 + *(long *)(_ifs + -0x18)) != 0) {
      __assert_fail("ifs.good()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cubuspl42[P]aghsm/main.cpp"
                    ,0xc,"int main(int, char **)");
    }
    assembler._sourceStream = (istream *)&ifs;
    Assembler::compile(&program,&assembler);
    VM::VM(&vm);
    std::vector<Word,_std::allocator<Word>_>::vector
              ((vector<Word,_std::allocator<Word>_> *)&local_238,&program);
    VM::load(&vm,(vector<Word,_std::allocator<Word>_> *)&local_238);
    std::_Vector_base<Word,_std::allocator<Word>_>::~_Vector_base(&local_238);
    VM::run(&vm);
  }
  std::_Vector_base<Word,_std::allocator<Word>_>::~_Vector_base
            (&vm._program.super__Vector_base<Word,_std::allocator<Word>_>);
  std::_Vector_base<Word,_std::allocator<Word>_>::~_Vector_base
            (&program.super__Vector_base<Word,_std::allocator<Word>_>);
LAB_0010e049:
  std::ifstream::~ifstream(&ifs);
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
	std::ifstream ifs;

	if (argc == 1) {
		ifs.open("1.asm");
		assert(ifs.good());

		Assembler assembler(ifs);
		auto program = assembler.compile();
		VM vm;
		vm.load(program);
		vm.run();
	} else if (argc == 2) {
		ifs.open(argv[1]);
		
		if (!ifs.good()) {
			std::cerr << "Unable to open file" << std::endl;
			return 1;
		}

		try {
			Assembler assembler(ifs);
			auto program = assembler.compile();
			VM vm;
			vm.load(program);
			vm.run();
		} catch (std::exception &e) {
			std::cerr << e.what() << std::endl;
			return 1;
		}
	}

    return 0;
}